

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

unsigned_long
mxx::scatter_one<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *msgs,int root,comm *comm)

{
  int rank;
  unsigned_long result;
  uint local_34;
  unsigned_long local_30;
  
  if ((comm->m_rank == root) &&
     ((long)(msgs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(msgs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)comm->m_size)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_34);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",(ulong)local_34,
           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/collective.hpp"
           ,0xfe,"scatter_one",
           "comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size())");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  scatter<unsigned_long>
            ((msgs->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start,1,&local_30,root,comm);
  return local_30;
}

Assistant:

T scatter_one(const std::vector<T>& msgs, int root, const mxx::comm& comm = mxx::comm()) {
    MXX_ASSERT(comm.rank() != root || msgs.size() == static_cast<size_t>(comm.size()));
    T result;
    scatter(&msgs[0], 1, &result, root, comm);
    return result;
}